

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::str_format_internal::(anonymous_namespace)::
FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,double>
          (_anonymous_namespace_ *this,Decomposed<double> decomposed,size_t precision,Buffer *out,
          int *exp)

{
  undefined1 int_mantissa [16];
  bool bVar1;
  Buffer *out_00;
  int *exp_local;
  Buffer *out_local;
  size_t precision_local;
  Decomposed<double> decomposed_local;
  
  out_00 = decomposed._8_8_;
  if (out_00 < (Buffer *)0x28) {
    bVar1 = FloatToBufferImpl<unsigned_long,double,(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1>
                      ((unsigned_long)this,(uint)decomposed.mantissa,(size_t)out_00,
                       (Buffer *)precision,(int *)out);
    if (bVar1) {
      decomposed_local._15_1_ = 1;
    }
    else {
      int_mantissa._8_8_ = 0;
      int_mantissa._0_8_ = this;
      decomposed_local._15_1_ =
           FloatToBufferImpl<unsigned__int128,double,(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1>
                     (this,(unsigned___int128)int_mantissa,0,(ulong)(uint)decomposed.mantissa,out_00
                      ,(int *)precision);
    }
  }
  else {
    decomposed_local._15_1_ = 0;
  }
  return (bool)decomposed_local._15_1_;
}

Assistant:

bool FloatToBuffer(Decomposed<Float> decomposed,
                   size_t precision,
                   Buffer* out,
                   int* exp) {
  if (precision > kMaxFixedPrecision) return false;

  // Try with uint64_t.
  if (CanFitMantissa<Float, std::uint64_t>() &&
      FloatToBufferImpl<std::uint64_t, Float, mode>(
          static_cast<std::uint64_t>(decomposed.mantissa), decomposed.exponent,
          precision, out, exp))
    return true;

#if defined(ABSL_HAVE_INTRINSIC_INT128)
  // If that is not enough, try with __uint128_t.
  return CanFitMantissa<Float, __uint128_t>() &&
         FloatToBufferImpl<__uint128_t, Float, mode>(
             static_cast<__uint128_t>(decomposed.mantissa), decomposed.exponent,
             precision, out, exp);
#endif
  return false;
}